

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O2

void * FilterRender::doColor
                 (void *data,uint width,uint height,u_int8_t r,u_int8_t g,u_int8_t b,u_int8_t a)

{
  ushort *puVar1;
  ulong uVar2;
  int i;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  int j;
  ulong uVar7;
  ulong uVar8;
  int i_3;
  int j_4;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  uVar2 = (ulong)width;
  uVar7 = (ulong)height;
  pvVar3 = operator_new__(uVar7 * 8);
  for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    pvVar4 = operator_new__(uVar2 * 8);
    *(void **)((long)pvVar3 + uVar9 * 8) = pvVar4;
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      pvVar5 = operator_new__(4);
      *(void **)((long)pvVar4 + uVar8 * 8) = pvVar5;
    }
  }
  pvVar4 = data;
  for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        *(undefined1 *)(*(long *)(*(long *)((long)pvVar3 + uVar9 * 8) + uVar8 * 8) + lVar6) =
             *(undefined1 *)((long)pvVar4 + lVar6);
      }
      pvVar4 = (void *)((long)pvVar4 + 4);
    }
  }
  for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      lVar6 = *(long *)((long)pvVar3 + uVar9 * 8);
      puVar1 = *(ushort **)(lVar6 + uVar8 * 8);
      dVar11 = ((double)(byte)puVar1[1] + (double)(byte)(*puVar1 >> 8) + (double)(*puVar1 & 0xff)) /
               (double)((uint)g + (uint)r + (uint)b);
      dVar10 = dVar11 * (double)b;
      if (255.0 <= dVar10) {
        dVar10 = 255.0;
      }
      *(char *)puVar1 = (char)(int)dVar10;
      dVar10 = dVar11 * (double)g;
      if (255.0 <= dVar10) {
        dVar10 = 255.0;
      }
      dVar11 = dVar11 * (double)r;
      if (255.0 <= dVar11) {
        dVar11 = 255.0;
      }
      *(char *)(*(long *)(lVar6 + uVar8 * 8) + 1) = (char)(int)dVar10;
      *(char *)(*(long *)(lVar6 + uVar8 * 8) + 2) = (char)(int)dVar11;
    }
  }
  for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        *(undefined1 *)((long)data + lVar6) =
             *(undefined1 *)(*(long *)(*(long *)((long)pvVar3 + uVar9 * 8) + uVar8 * 8) + lVar6);
      }
      data = (void *)((long)data + 4);
    }
  }
  uVar9 = 0;
  do {
    if (uVar9 == uVar7) {
      operator_delete__(pvVar3);
    }
    for (uVar8 = 0; pvVar4 = *(void **)((long)pvVar3 + uVar9 * 8), uVar2 != uVar8; uVar8 = uVar8 + 1
        ) {
      pvVar4 = *(void **)((long)pvVar4 + uVar8 * 8);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
    }
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void* FilterRender::doColor(void *data, uint width, uint height, u_int8_t r, u_int8_t g, u_int8_t b, u_int8_t a) {
	//std::cerr << "fuckyou" << std::endl;
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			double nw_sum = (1.*map[i][j][0] + map[i][j][1] + map[i][j][2])/(r+g+b);
				map[i][j][0] = std::min(255., nw_sum*b);
				map[i][j][1] = std::min(255., nw_sum*g);
				map[i][j][2] = std::min(255., nw_sum*r);
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}